

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineSpecConstantTests.cpp
# Opt level: O2

string * vkt::pipeline::anon_unknown_0::composite_case_internal::
         generateInitializerListWithSpecConstant
                   (string *__return_storage_ptr__,DataType type,bool castToType,int idxBegin,
                   int idxEnd,string *specConstName,int specConstNdx)

{
  string *psVar1;
  DataType DVar2;
  ostream *poVar3;
  char **value;
  int iVar4;
  char *pcVar5;
  bool bVar6;
  string iVal;
  ostringstream str;
  char *local_260;
  string *local_258;
  string *local_250;
  string local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  string local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  ostringstream local_1a8 [376];
  
  local_258 = __return_storage_ptr__;
  local_250 = specConstName;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  iVar4 = 0;
  for (; psVar1 = local_258, idxBegin < idxEnd; idxBegin = idxBegin + 1) {
    if (specConstNdx == idxBegin) {
      std::__cxx11::string::string((string *)&local_248,(string *)local_250);
    }
    else {
      DVar2 = glu::getDataTypeScalarType(type);
      if (DVar2 == TYPE_BOOL) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_248,"true",(allocator<char> *)&local_260);
      }
      else {
        local_228._M_dataplus._M_p._0_4_ = idxBegin + 1;
        de::toString<int>(&local_248,(int *)&local_228);
      }
    }
    bVar6 = iVar4 == 0;
    iVar4 = iVar4 + -1;
    pcVar5 = ", ";
    if (bVar6) {
      pcVar5 = "";
    }
    poVar3 = std::operator<<((ostream *)local_1a8,pcVar5);
    if (castToType) {
      local_260 = glu::getDataTypeName(type);
      de::toString<char_const*>(&local_208,(de *)&local_260,value);
      std::operator+(&local_1e8,&local_208,"(");
      std::operator+(&local_1c8,&local_1e8,&local_248);
      std::operator+(&local_228,&local_1c8,")");
    }
    else {
      std::__cxx11::string::string((string *)&local_228,(string *)&local_248);
    }
    std::operator<<(poVar3,(string *)&local_228);
    std::__cxx11::string::~string((string *)&local_228);
    if (castToType) {
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_208);
    }
    std::__cxx11::string::~string((string *)&local_248);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return psVar1;
}

Assistant:

std::string generateInitializerListWithSpecConstant (const glu::DataType	type,
													 const bool				castToType,
													 const int				idxBegin,
													 const int				idxEnd,
													 const std::string&		specConstName,
													 const int				specConstNdx)
{
	std::ostringstream str;

	for (int i = idxBegin; i < idxEnd; ++i)
	{
		const std::string iVal = (i == specConstNdx ? specConstName : glu::getDataTypeScalarType(type) == glu::TYPE_BOOL ? "true" : de::toString(i + 1));
		str << (i != idxBegin ? ", " : "") << (castToType ? de::toString(glu::getDataTypeName(type)) + "(" + iVal + ")" : iVal);
	}

	return str.str();
}